

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O1

int xmlPatternMaxDepth(xmlPatternPtr comp)

{
  int iVar1;
  xmlStreamCompPtr pxVar2;
  int iVar3;
  long lVar4;
  
  if (comp != (xmlPatternPtr)0x0) {
    iVar3 = 0;
    while (pxVar2 = comp->stream, pxVar2 != (xmlStreamCompPtr)0x0) {
      iVar1 = pxVar2->nbStep;
      if (0 < (long)iVar1) {
        lVar4 = 0;
        do {
          if ((*(byte *)((long)&pxVar2->steps->flags + lVar4) & 1) != 0) {
            return -2;
          }
          lVar4 = lVar4 + 0x20;
        } while ((long)iVar1 << 5 != lVar4);
      }
      if (iVar3 < iVar1) {
        iVar3 = iVar1;
      }
      comp = comp->next;
      if (comp == (_xmlPattern *)0x0) {
        return iVar3;
      }
    }
  }
  return -1;
}

Assistant:

int
xmlPatternMaxDepth(xmlPatternPtr comp) {
    int ret = 0, i;
    if (comp == NULL)
        return(-1);
    while (comp != NULL) {
        if (comp->stream == NULL)
	    return(-1);
	for (i = 0;i < comp->stream->nbStep;i++)
	    if (comp->stream->steps[i].flags & XML_STREAM_STEP_DESC)
	        return(-2);
	if (comp->stream->nbStep > ret)
	    ret = comp->stream->nbStep;
	comp = comp->next;
    }
    return(ret);
}